

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::WriteTableType(CWriter *this,Type *type)

{
  char *__s;
  size_t size;
  
  __s = GetReferenceTypeName(type);
  WriteData(this,"wasm_rt_",8);
  size = strlen(__s);
  WriteData(this,__s,size);
  WriteData(this,"_table_t",8);
  return;
}

Assistant:

void CWriter::WriteTableType(const wabt::Type& type) {
  Write("wasm_rt_", GetReferenceTypeName(type), "_table_t");
}